

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextVkImpl::UpdateBufferRegion
          (DeviceContextVkImpl *this,BufferVkImpl *pBuffVk,Uint64 DstOffset,Uint64 NumBytes,
          VkBuffer vkSrcBuffer,Uint64 SrcOffset,RESOURCE_STATE_TRANSITION_MODE TransitionMode)

{
  Uint32 *pUVar1;
  VkBuffer dstBuffer;
  VkBufferCopy CopyRegion;
  string local_70;
  VkBuffer local_50;
  VkBufferCopy local_48;
  
  local_50 = vkSrcBuffer;
  if ((pBuffVk->super_BufferBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
      .m_Desc.Size < NumBytes + DstOffset) {
    FormatString<char[81]>
              (&local_70,
               (char (*) [81])
               "Update region is out of buffer bounds which will result in an undefined behavior");
    DebugAssertionFailed
              (local_70._M_dataplus._M_p,"UpdateBufferRegion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x82a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  EnsureVkCmdBuffer(this);
  TransitionOrVerifyBufferState
            (this,pBuffVk,TransitionMode,RESOURCE_STATE_COPY_DEST,VK_ACCESS_TRANSFER_WRITE_BIT,
             "Updating buffer (DeviceContextVkImpl::UpdateBufferRegion)");
  local_48.srcOffset = SrcOffset;
  local_48.dstOffset = DstOffset;
  local_48.size = NumBytes;
  if ((pBuffVk->m_VulkanBuffer).m_VkObject == (VkBuffer_T *)0x0) {
    FormatString<char[49]>
              (&local_70,(char (*) [49])"Copy destination buffer must not be suballocated");
    DebugAssertionFailed
              (local_70._M_dataplus._M_p,"UpdateBufferRegion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x833);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  dstBuffer = BufferVkImpl::GetVkBuffer(pBuffVk);
  VulkanUtilities::VulkanCommandBuffer::CopyBuffer
            (&this->m_CommandBuffer,local_50,dstBuffer,1,&local_48);
  pUVar1 = &(this->m_State).NumCommands;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

void DeviceContextVkImpl::UpdateBufferRegion(BufferVkImpl*                  pBuffVk,
                                             Uint64                         DstOffset,
                                             Uint64                         NumBytes,
                                             VkBuffer                       vkSrcBuffer,
                                             Uint64                         SrcOffset,
                                             RESOURCE_STATE_TRANSITION_MODE TransitionMode)
{
    DEV_CHECK_ERR(DstOffset + NumBytes <= pBuffVk->GetDesc().Size,
                  "Update region is out of buffer bounds which will result in an undefined behavior");

    EnsureVkCmdBuffer();
    TransitionOrVerifyBufferState(*pBuffVk, TransitionMode, RESOURCE_STATE_COPY_DEST, VK_ACCESS_TRANSFER_WRITE_BIT, "Updating buffer (DeviceContextVkImpl::UpdateBufferRegion)");

    VkBufferCopy CopyRegion;
    CopyRegion.srcOffset = SrcOffset;
    CopyRegion.dstOffset = DstOffset;
    CopyRegion.size      = NumBytes;
    VERIFY(pBuffVk->m_VulkanBuffer != VK_NULL_HANDLE, "Copy destination buffer must not be suballocated");
    m_CommandBuffer.CopyBuffer(vkSrcBuffer, pBuffVk->GetVkBuffer(), 1, &CopyRegion);
    ++m_State.NumCommands;
}